

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcolor.cpp
# Opt level: O2

void test_colors(wins *wins_ar,int ar_len)

{
  undefined8 *puVar1;
  Am_Drawonable *d;
  ulong uVar2;
  ulong uVar3;
  Am_Style aAStack_38 [8];
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x40 != uVar3; uVar3 = uVar3 + 0x40) {
    puVar1 = *(undefined8 **)((long)&wins_ar->root + uVar3);
    Am_Style::Am_Style(aAStack_38,(Am_Style *)&Am_No_Style);
    d = (Am_Drawonable *)
        (**(code **)*puVar1)(puVar1,10,0x32,300,0x1e0,"","",1,0,aAStack_38,0,1,1,0,0,1,0,0,1,0);
    Am_Style::~Am_Style(aAStack_38);
    *(Am_Drawonable **)((long)&wins_ar->color_win + uVar3) = d;
    draw_colors(d);
    (**(code **)(*(long *)d + 0xa0))(d);
  }
  return;
}

Assistant:

void
test_colors(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *the_color_win = (wins_ar[i].root)->Create(10, 50, 300, 480);
    wins_ar[i].color_win = the_color_win;
    draw_colors(the_color_win);
    the_color_win->Flush_Output();
  }
}